

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O0

Abc_Ntk_t * Io_ReadBlifAsAig(char *pFileName,int fCheck)

{
  int iVar1;
  FILE *__stream;
  Io_BlifMan_t *p_00;
  char *pcVar2;
  Abc_Ntk_t *pAig;
  Io_BlifMan_t *p;
  FILE *pFile;
  int fCheck_local;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Io_Blif(): The file is unavailable (absent or open).\n");
    pFileName_local = (char *)0x0;
  }
  else {
    fclose(__stream);
    p_00 = Io_BlifAlloc();
    p_00->pFileName = pFileName;
    pcVar2 = Io_BlifLoadFile(pFileName);
    p_00->pBuffer = pcVar2;
    if (p_00->pBuffer == (char *)0x0) {
      Io_BlifFree(p_00);
      pFileName_local = (char *)0x0;
    }
    else {
      Io_BlifReadPreparse(p_00);
      pFileName_local = (char *)Io_BlifParse(p_00);
      if (p_00->sError[0] != '\0') {
        fprintf(_stdout,"%s\n",p_00->sError);
      }
      if ((Abc_Ntk_t *)pFileName_local == (Abc_Ntk_t *)0x0) {
        pFileName_local = (char *)0x0;
      }
      else {
        Io_BlifFree(p_00);
        if ((fCheck != 0) && (iVar1 = Abc_NtkCheckRead((Abc_Ntk_t *)pFileName_local), iVar1 == 0)) {
          printf("Io_Blif: The network check has failed.\n");
          Abc_NtkDelete((Abc_Ntk_t *)pFileName_local);
          pFileName_local = (char *)0x0;
        }
      }
    }
  }
  return (Abc_Ntk_t *)pFileName_local;
}

Assistant:

Abc_Ntk_t * Io_ReadBlifAsAig( char * pFileName, int fCheck )
{
    FILE * pFile;
    Io_BlifMan_t * p;
    Abc_Ntk_t * pAig;

    // check that the file is available
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Io_Blif(): The file is unavailable (absent or open).\n" );
        return 0;
    }
    fclose( pFile );

    // start the file reader
    p = Io_BlifAlloc();
    p->pFileName = pFileName;
    p->pBuffer   = Io_BlifLoadFile( pFileName );
    if ( p->pBuffer == NULL )
    {
        Io_BlifFree( p );
        return NULL;
    }
    // prepare the file for parsing
    Io_BlifReadPreparse( p );
    // construct the network
    pAig = Io_BlifParse( p );
    if ( p->sError[0] )
        fprintf( stdout, "%s\n", p->sError );
    if ( pAig == NULL )
        return NULL;
    Io_BlifFree( p );

    // make sure that everything is okay with the network structure
    if ( fCheck && !Abc_NtkCheckRead( pAig ) )
    {
        printf( "Io_Blif: The network check has failed.\n" );
        Abc_NtkDelete( pAig );
        return NULL;
    }
    return pAig;
}